

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_ModuleSymbolStream.cpp
# Opt level: O2

void __thiscall
PDB::ModuleSymbolStream::ModuleSymbolStream
          (ModuleSymbolStream *this,RawFile *file,uint16_t streamIndex,uint32_t symbolStreamSize)

{
  undefined6 in_register_00000012;
  
  CoalescedMSFStream::CoalescedMSFStream
            (&this->m_stream,file->m_data,file->m_superBlock->blockSize,
             file->m_streamBlocks[CONCAT62(in_register_00000012,streamIndex) & 0xffffffff],
             symbolStreamSize);
  return;
}

Assistant:

PDB::ModuleSymbolStream::ModuleSymbolStream(const RawFile& file, uint16_t streamIndex, uint32_t symbolStreamSize) PDB_NO_EXCEPT
	: m_stream(file.CreateMSFStream<CoalescedMSFStream>(streamIndex, symbolStreamSize))
{
	// https://llvm.org/docs/PDB/ModiStream.html
	// struct ModiStream {
	//	uint32_t Signature;
	//	uint8_t Symbols[SymbolSize - 4];
	//	uint8_t C11LineInfo[C11Size];
	//	uint8_t C13LineInfo[C13Size];
	//	uint32_t GlobalRefsSize;
	//	uint8_t GlobalRefs[GlobalRefsSize];
	// };
	// we are only interested in the symbols, but not the line information or global refs.
	// the coalesced stream is therefore only built for the symbols, not all the data in the stream.
	// this potentially saves a lot of memory and performance on large PDBs.
}